

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O2

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::operator/=(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,double s)

{
  unsigned_short ***pppuVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long i;
  ulong uVar9;
  
  uVar5 = 0;
  uVar3 = image->height;
  if (image->height < 1) {
    uVar3 = uVar5;
  }
  uVar2 = (ulong)(uint)image->depth;
  if (image->depth < 1) {
    uVar2 = uVar5;
  }
  for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    uVar7 = image->width;
    if (image->width < 1) {
      uVar7 = uVar5;
    }
    for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      pppuVar1 = image->img;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        iVar4 = (int)((double)pppuVar1[uVar6][uVar8][uVar9] / s);
        if (0xfffe < iVar4) {
          iVar4 = 0xffff;
        }
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        pppuVar1[uVar6][uVar8][uVar9] = (unsigned_short)iVar4;
      }
    }
  }
  return image;
}

Assistant:

Image<T> &operator/=(Image<T> &image, double s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, static_cast<typename Image<T>::work_t>(v/s));
        }
      }
    }
  }

  return image;
}